

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

void hydro_random_buf(void *out,size_t out_len)

{
  uint8_t *state_u8;
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  uchar *dst;
  uchar *src;
  long *in_FS_OFFSET;
  
  hydro_random_ensure_initialized();
  if (out_len < 0x10) {
    lVar3 = 0;
  }
  else {
    uVar4 = out_len >> 4;
    lVar1 = *in_FS_OFFSET;
    state_u8 = (uint8_t *)(lVar1 + -0x40);
    lVar3 = 0;
    do {
      gimli_core_u8(state_u8,'\0');
      uVar2 = *(undefined8 *)(lVar1 + -0x38);
      *(undefined8 *)((long)out + lVar3) = *(undefined8 *)state_u8;
      ((undefined8 *)((long)out + lVar3))[1] = uVar2;
      lVar3 = lVar3 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if ((out_len & 0xf) != 0) {
    lVar1 = *in_FS_OFFSET;
    gimli_core_u8((uint8_t *)(lVar1 + -0x40),'\0');
    memcpy((void *)((long)out + lVar3),(uint8_t *)(lVar1 + -0x40),out_len & 0xf);
  }
  in_FS_OFFSET[-8] = 0;
  in_FS_OFFSET[-7] = 0;
  in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
  in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
  gimli_core_u8((uint8_t *)(*in_FS_OFFSET + -0x40),'\0');
  *(undefined1 *)((long)in_FS_OFFSET + -7) = 0x10;
  return;
}

Assistant:

void
hydro_random_buf(void *out, size_t out_len)
{
    uint8_t *p = (uint8_t *) out;
    size_t   i;
    size_t   leftover;

    hydro_random_ensure_initialized();
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(hydro_random_context.state, 0);
        memcpy(p + i * gimli_RATE, hydro_random_context.state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(hydro_random_context.state, 0);
        mem_cpy(p + i * gimli_RATE, hydro_random_context.state, leftover);
    }
    hydro_random_ratchet();
}